

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RndFun.cpp
# Opt level: O3

void PrintSarrBytes(Sarray *A)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  int y;
  long lVar7;
  long lVar8;
  char local_41;
  long local_40;
  Sarray *local_38;
  
  bVar4 = true;
  lVar7 = 0;
  local_38 = A;
  do {
    lVar6 = 0;
    bVar3 = bVar4;
    do {
      lVar8 = 0;
      local_40 = lVar6;
      do {
        lVar5 = std::cout;
        uVar1 = *(ulong *)(*(long *)&(local_38->
                                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[lVar6].
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data + lVar7 * 8);
        *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 2;
        lVar2 = *(long *)(lVar5 + -0x18);
        if (*(char *)(lVar2 + 0x107161) == '\0') {
          std::ios::widen((char)lVar2 + -0x80);
          *(undefined1 *)(lVar2 + 0x107161) = 1;
          lVar5 = std::cout;
        }
        *(undefined1 *)(lVar2 + 0x107160) = 0x30;
        *(uint *)(std::ios_base::Init::Init + *(long *)(lVar5 + -0x18)) =
             *(uint *)(std::ios_base::Init::Init + *(long *)(lVar5 + -0x18)) & 0xffffffb5 | 8;
        std::ostream::operator<<((ostream *)&std::cout,(uint)(uVar1 >> ((byte)lVar8 & 0x3f)) & 0xff)
        ;
        lVar8 = lVar8 + 8;
      } while (lVar8 != 0x40);
      if (bVar3) {
        local_41 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_41,1);
      }
      else {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
        std::ostream::put(-0x80);
        std::ostream::flush();
      }
      bVar3 = (bool)(bVar3 ^ 1);
      lVar6 = local_40 + 1;
    } while (lVar6 != 5);
    bVar4 = (bool)(bVar4 ^ 1);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  return;
}

Assistant:

void PrintSarrBytes(Sarray A){
    bool b = true;
    for(int y = 0; y < 5; y++){
        for(int x = 0; x < 5; x++){
            for(int i = 0; i < 8; i ++){
                uint64_t a = A[x][y] >> (8*i);
                int x = a&255;
                cout <<  setw(2) << setfill('0') << hex << x;
            }
            if(b){cout << ' ';}
            else{ cout << endl;}
            b = !b;
        }

    }
    cout << endl;
}